

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

char * uv_err_name_r(int err,char *buf,size_t buflen)

{
  size_t buflen_local;
  char *buf_local;
  int err_local;
  
  if (err == -0xfff) {
    uv__strscpy(buf,"EOF",buflen);
  }
  else if (err == -0xffe) {
    uv__strscpy(buf,"UNKNOWN",buflen);
  }
  else if (err == -0xff0) {
    uv__strscpy(buf,"ECHARSET",buflen);
  }
  else if (err == -0xfbc) {
    uv__strscpy(buf,"EFTYPE",buflen);
  }
  else if (err == -0xbc6) {
    uv__strscpy(buf,"EAI_PROTOCOL",buflen);
  }
  else if (err == -0xbc5) {
    uv__strscpy(buf,"EAI_BADHINTS",buflen);
  }
  else if (err == -0xbc3) {
    uv__strscpy(buf,"EAI_SOCKTYPE",buflen);
  }
  else if (err == -0xbc2) {
    uv__strscpy(buf,"EAI_SERVICE",buflen);
  }
  else if (err == -0xbc1) {
    uv__strscpy(buf,"EAI_OVERFLOW",buflen);
  }
  else if (err == -0xbc0) {
    uv__strscpy(buf,"EAI_NONAME",buflen);
  }
  else if (err == -0xbbf) {
    uv__strscpy(buf,"EAI_NODATA",buflen);
  }
  else if (err == -0xbbe) {
    uv__strscpy(buf,"EAI_MEMORY",buflen);
  }
  else if (err == -0xbbd) {
    uv__strscpy(buf,"EAI_FAMILY",buflen);
  }
  else if (err == -0xbbc) {
    uv__strscpy(buf,"EAI_FAIL",buflen);
  }
  else if (err == -0xbbb) {
    uv__strscpy(buf,"EAI_CANCELED",buflen);
  }
  else if (err == -0xbba) {
    uv__strscpy(buf,"EAI_BADFLAGS",buflen);
  }
  else if (err == -0xbb9) {
    uv__strscpy(buf,"EAI_AGAIN",buflen);
  }
  else if (err == -3000) {
    uv__strscpy(buf,"EAI_ADDRFAMILY",buflen);
  }
  else if (err == -0x7d) {
    uv__strscpy(buf,"ECANCELED",buflen);
  }
  else if (err == -0x79) {
    uv__strscpy(buf,"EREMOTEIO",buflen);
  }
  else if (err == -0x72) {
    uv__strscpy(buf,"EALREADY",buflen);
  }
  else if (err == -0x71) {
    uv__strscpy(buf,"EHOSTUNREACH",buflen);
  }
  else if (err == -0x70) {
    uv__strscpy(buf,"EHOSTDOWN",buflen);
  }
  else if (err == -0x6f) {
    uv__strscpy(buf,"ECONNREFUSED",buflen);
  }
  else if (err == -0x6e) {
    uv__strscpy(buf,"ETIMEDOUT",buflen);
  }
  else if (err == -0x6c) {
    uv__strscpy(buf,"ESHUTDOWN",buflen);
  }
  else if (err == -0x6b) {
    uv__strscpy(buf,"ENOTCONN",buflen);
  }
  else if (err == -0x6a) {
    uv__strscpy(buf,"EISCONN",buflen);
  }
  else if (err == -0x69) {
    uv__strscpy(buf,"ENOBUFS",buflen);
  }
  else if (err == -0x68) {
    uv__strscpy(buf,"ECONNRESET",buflen);
  }
  else if (err == -0x67) {
    uv__strscpy(buf,"ECONNABORTED",buflen);
  }
  else if (err == -0x65) {
    uv__strscpy(buf,"ENETUNREACH",buflen);
  }
  else if (err == -100) {
    uv__strscpy(buf,"ENETDOWN",buflen);
  }
  else if (err == -99) {
    uv__strscpy(buf,"EADDRNOTAVAIL",buflen);
  }
  else if (err == -0x62) {
    uv__strscpy(buf,"EADDRINUSE",buflen);
  }
  else if (err == -0x61) {
    uv__strscpy(buf,"EAFNOSUPPORT",buflen);
  }
  else if (err == -0x5f) {
    uv__strscpy(buf,"ENOTSUP",buflen);
  }
  else if (err == -0x5e) {
    uv__strscpy(buf,"ESOCKTNOSUPPORT",buflen);
  }
  else if (err == -0x5d) {
    uv__strscpy(buf,"EPROTONOSUPPORT",buflen);
  }
  else if (err == -0x5c) {
    uv__strscpy(buf,"ENOPROTOOPT",buflen);
  }
  else if (err == -0x5b) {
    uv__strscpy(buf,"EPROTOTYPE",buflen);
  }
  else if (err == -0x5a) {
    uv__strscpy(buf,"EMSGSIZE",buflen);
  }
  else if (err == -0x59) {
    uv__strscpy(buf,"EDESTADDRREQ",buflen);
  }
  else if (err == -0x58) {
    uv__strscpy(buf,"ENOTSOCK",buflen);
  }
  else if (err == -0x54) {
    uv__strscpy(buf,"EILSEQ",buflen);
  }
  else if (err == -0x4b) {
    uv__strscpy(buf,"EOVERFLOW",buflen);
  }
  else if (err == -0x47) {
    uv__strscpy(buf,"EPROTO",buflen);
  }
  else if (err == -0x40) {
    uv__strscpy(buf,"ENONET",buflen);
  }
  else if (err == -0x28) {
    uv__strscpy(buf,"ELOOP",buflen);
  }
  else if (err == -0x27) {
    uv__strscpy(buf,"ENOTEMPTY",buflen);
  }
  else if (err == -0x26) {
    uv__strscpy(buf,"ENOSYS",buflen);
  }
  else if (err == -0x24) {
    uv__strscpy(buf,"ENAMETOOLONG",buflen);
  }
  else if (err == -0x22) {
    uv__strscpy(buf,"ERANGE",buflen);
  }
  else if (err == -0x20) {
    uv__strscpy(buf,"EPIPE",buflen);
  }
  else if (err == -0x1f) {
    uv__strscpy(buf,"EMLINK",buflen);
  }
  else if (err == -0x1e) {
    uv__strscpy(buf,"EROFS",buflen);
  }
  else if (err == -0x1d) {
    uv__strscpy(buf,"ESPIPE",buflen);
  }
  else if (err == -0x1c) {
    uv__strscpy(buf,"ENOSPC",buflen);
  }
  else if (err == -0x1b) {
    uv__strscpy(buf,"EFBIG",buflen);
  }
  else if (err == -0x1a) {
    uv__strscpy(buf,"ETXTBSY",buflen);
  }
  else if (err == -0x19) {
    uv__strscpy(buf,"ENOTTY",buflen);
  }
  else if (err == -0x18) {
    uv__strscpy(buf,"EMFILE",buflen);
  }
  else if (err == -0x17) {
    uv__strscpy(buf,"ENFILE",buflen);
  }
  else if (err == -0x16) {
    uv__strscpy(buf,"EINVAL",buflen);
  }
  else if (err == -0x15) {
    uv__strscpy(buf,"EISDIR",buflen);
  }
  else if (err == -0x14) {
    uv__strscpy(buf,"ENOTDIR",buflen);
  }
  else if (err == -0x13) {
    uv__strscpy(buf,"ENODEV",buflen);
  }
  else if (err == -0x12) {
    uv__strscpy(buf,"EXDEV",buflen);
  }
  else if (err == -0x11) {
    uv__strscpy(buf,"EEXIST",buflen);
  }
  else if (err == -0x10) {
    uv__strscpy(buf,"EBUSY",buflen);
  }
  else if (err == -0xe) {
    uv__strscpy(buf,"EFAULT",buflen);
  }
  else if (err == -0xd) {
    uv__strscpy(buf,"EACCES",buflen);
  }
  else if (err == -0xc) {
    uv__strscpy(buf,"ENOMEM",buflen);
  }
  else if (err == -0xb) {
    uv__strscpy(buf,"EAGAIN",buflen);
  }
  else if (err == -9) {
    uv__strscpy(buf,"EBADF",buflen);
  }
  else if (err == -7) {
    uv__strscpy(buf,"E2BIG",buflen);
  }
  else if (err == -6) {
    uv__strscpy(buf,"ENXIO",buflen);
  }
  else if (err == -5) {
    uv__strscpy(buf,"EIO",buflen);
  }
  else if (err == -4) {
    uv__strscpy(buf,"EINTR",buflen);
  }
  else if (err == -3) {
    uv__strscpy(buf,"ESRCH",buflen);
  }
  else if (err == -2) {
    uv__strscpy(buf,"ENOENT",buflen);
  }
  else if (err == -1) {
    uv__strscpy(buf,"EPERM",buflen);
  }
  else {
    snprintf(buf,buflen,"Unknown system error %d",(ulong)(uint)err);
  }
  return buf;
}

Assistant:

char* uv_err_name_r(int err, char* buf, size_t buflen) {
  switch (err) {
    UV_ERRNO_MAP(UV_ERR_NAME_GEN_R)
    default: snprintf(buf, buflen, "Unknown system error %d", err);
  }
  return buf;
}